

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_constructors.hpp
# Opt level: O1

Proxy_Function chaiscript::dispatch::detail::build_constructor_<unsigned_int>(_func_uint *param_1)

{
  Proxy_Function_Base *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Proxy_Function PVar1;
  
  __p = (Proxy_Function_Base *)operator_new(0x28);
  Proxy_Function_Callable_Impl<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/../dispatchkit/proxy_constructors.hpp:25:19)>
  ::Proxy_Function_Callable_Impl
            ((Proxy_Function_Callable_Impl<unsigned_int_(),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ChaiScript[P]ChaiScript_static_libs____include_chaiscript_language____dispatchkit_proxy_constructors_hpp:25:19)>
              *)__p);
  *(Proxy_Function_Base **)param_1 = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Proxy_Function_Base*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(param_1 + 8),__p);
  PVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)param_1;
  return (Proxy_Function)
         PVar1.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Proxy_Function build_constructor_(Class (*)(Params...)) {
    if constexpr (!std::is_copy_constructible_v<Class>) {
      auto call = [](auto &&...param) { return std::make_shared<Class>(std::forward<decltype(param)>(param)...); };

      return Proxy_Function(
          chaiscript::make_shared<dispatch::Proxy_Function_Base,
                                  dispatch::Proxy_Function_Callable_Impl<std::shared_ptr<Class>(Params...), decltype(call)>>(call));
    } else if constexpr (true) {
      auto call = [](auto &&...param) { return Class(std::forward<decltype(param)>(param)...); };

      return Proxy_Function(
          chaiscript::make_shared<dispatch::Proxy_Function_Base, dispatch::Proxy_Function_Callable_Impl<Class(Params...), decltype(call)>>(
              call));
    }
  }